

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUse(Parser *this)

{
  Token *pTVar1;
  Lexer *pLVar2;
  _Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> _Var3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  bool bVar9;
  Lexer *pLVar10;
  Parser *in_RSI;
  pointer __p;
  pointer __p_1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Position pos;
  Exprs exprs;
  undefined1 local_80 [16];
  Position local_70;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_58;
  
  sanityExpect(in_RSI,TOK_KW_USE);
  bVar9 = expect(in_RSI,TOK_KW_MOD);
  if (bVar9) {
    pTVar1 = in_RSI->lexer->currentToken;
    bVar9 = expect(in_RSI,TOK_ID);
    if (bVar9) {
      pLVar2 = in_RSI->lexer;
      pLVar10 = (Lexer *)operator_new(0x40);
      ProgNameExpr::ProgNameExpr((ProgNameExpr *)pLVar10,pLVar2,pTVar1);
      local_70.line = 0;
      this->lexer = pLVar10;
      std::unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_>::
      ~unique_ptr((unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_> *)
                  (local_80 + 0x10));
    }
    else {
      pTVar1 = in_RSI->lexer->currentToken;
      local_70.line = (size_t)operator_new(0x38);
      sVar6 = (pTVar1->pos).line;
      sVar7 = (pTVar1->pos).startIndex;
      sVar5 = (pTVar1->pos).endIndex;
      ((Error<pfederc::SyntaxErrorCode> *)local_70.line)->logLevel = LVL_ERROR;
      ((Error<pfederc::SyntaxErrorCode> *)local_70.line)->err = STX_ERR_EXPECTED_ID;
      (((Error<pfederc::SyntaxErrorCode> *)local_70.line)->pos).line = sVar6;
      (((Error<pfederc::SyntaxErrorCode> *)local_70.line)->pos).startIndex = sVar7;
      (((Error<pfederc::SyntaxErrorCode> *)local_70.line)->pos).endIndex = sVar5;
      (((Error<pfederc::SyntaxErrorCode> *)local_70.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(((Error<pfederc::SyntaxErrorCode> *)local_70.line)->extraPos).
               super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      *(pointer *)
       ((long)&(((Error<pfederc::SyntaxErrorCode> *)local_70.line)->extraPos).
               super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      generateError((Parser *)&stack0xffffffffffffffc8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffc8);
      if ((Error<pfederc::SyntaxErrorCode> *)local_70.line != (Error<pfederc::SyntaxErrorCode> *)0x0
         ) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)(local_80 + 0x10),
                   (Error<pfederc::SyntaxErrorCode> *)local_70.line);
      }
      this->lexer = (Lexer *)0x0;
    }
  }
  else {
    parseExpression((Parser *)local_80,(Precedence)in_RSI);
    if ((Lexer *)local_80._0_8_ == (Lexer *)0x0) {
      this->lexer = (Lexer *)0x0;
    }
    else {
      local_70.line = ((Position *)(local_80._0_8_ + 0x20))->line;
      local_70.startIndex =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&((Position *)(local_80._0_8_ + 0x20))->startIndex)->_M_allocated_capacity;
      local_70.endIndex = ((Position *)(local_80._0_8_ + 0x20))->endIndex;
      local_58.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)0x0;
      local_58.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(((string *)(local_80._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
        do {
          uVar8 = local_80._0_8_;
          if (*(undefined ***)local_80._0_8_ != &PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          if (*(short *)(local_80._0_8_ + 0x40) != 0x2e) break;
          if (*(undefined ***)local_80._0_8_ != &PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          local_80._8_8_ = *(long *)(local_80._0_8_ + 0x50);
          *(long *)(local_80._0_8_ + 0x50) = 0;
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::_M_insert_rval(&local_58,
                           (const_iterator)
                           local_58.
                           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,(value_type *)(local_80 + 8));
          if ((pointer)local_80._8_8_ != (pointer)0x0) {
            (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                           *)local_80._8_8_)->
                        super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                        )._M_t.
                        super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                        .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                       _M_head_impl)->pos).line)();
          }
          _Var3.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
               *(_Head_base<0UL,_pfederc::Expr_*,_false> *)(uVar8 + 0x48);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar8 + 0x48))->_M_allocated_capacity = 0;
          if ((Expr *)local_80._0_8_ != (Expr *)0x0) {
            lVar4 = *(long *)local_80._0_8_;
            local_80._0_8_ = _Var3.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
            (**(code **)(lVar4 + 8))();
            _Var3.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (_Head_base<0UL,_pfederc::Expr_*,_false>)
                 (_Head_base<0UL,_pfederc::Expr_*,_false>)local_80._0_8_;
          }
          local_80._0_8_ = _Var3.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        } while (*(int *)&(((string *)(local_80._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12);
      }
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval(&local_58,
                       (const_iterator)
                       local_58.
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_80);
      pLVar2 = in_RSI->lexer;
      pLVar10 = (Lexer *)operator_new(0x50);
      UseExpr::UseExpr((UseExpr *)pLVar10,pLVar2,(Position *)(local_80 + 0x10),&local_58);
      local_80._8_8_ = (pointer)0x0;
      this->lexer = pLVar10;
      std::unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_> *)
                 (local_80 + 8));
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector(&local_58);
    }
    if ((Expr *)local_80._0_8_ != (Expr *)0x0) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUse() noexcept {
  sanityExpect(TokenType::TOK_KW_USE);
  if (expect(TokenType::TOK_KW_MOD)) {
    const Token *tok = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    return std::make_unique<ProgNameExpr>(lexer, tok);
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    return nullptr;

  Position pos(expr->getPosition());

  Exprs exprs;
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    exprs.insert(exprs.begin(), biopexpr.getRightPtr());
    expr = biopexpr.getLeftPtr();
  }

  exprs.insert(exprs.begin(), std::move(expr));

  return std::make_unique<UseExpr>(lexer, pos, std::move(exprs));
}